

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall
tinyusdz::MaterialBinding::get_materialBinding
          (MaterialBinding *this,token *mat_purpose,Relationship *relOut)

{
  bool bVar1;
  ulong uVar2;
  string *psVar3;
  value_type *pvVar4;
  size_type sVar5;
  mapped_type *pmVar6;
  Relationship *relOut_local;
  token *mat_purpose_local;
  MaterialBinding *this_local;
  
  if (relOut == (Relationship *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    Token::str_abi_cxx11_(mat_purpose);
    uVar2 = ::std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      psVar3 = Token::str_abi_cxx11_(mat_purpose);
      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )psVar3,"full");
      if (bVar1) {
        bVar1 = nonstd::optional_lite::optional<tinyusdz::Relationship>::has_value
                          (&this->materialBindingFull);
        if (bVar1) {
          pvVar4 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                             (&this->materialBindingFull);
          Relationship::operator=(relOut,pvVar4);
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        psVar3 = Token::str_abi_cxx11_(mat_purpose);
        bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)psVar3,"preview");
        if (bVar1) {
          bVar1 = nonstd::optional_lite::optional<tinyusdz::Relationship>::has_value
                            (&this->materialBindingPreview);
          if (bVar1) {
            pvVar4 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                               (&this->materialBindingPreview);
            Relationship::operator=(relOut,pvVar4);
            this_local._7_1_ = true;
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          psVar3 = Token::str_abi_cxx11_(mat_purpose);
          sVar5 = ::std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship>_>_>
                  ::count(&this->_materialBindingMap,psVar3);
          if (sVar5 == 0) {
            this_local._7_1_ = false;
          }
          else {
            psVar3 = Token::str_abi_cxx11_(mat_purpose);
            pmVar6 = ::std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship>_>_>
                     ::at(&this->_materialBindingMap,psVar3);
            Relationship::operator=(relOut,pmVar6);
            this_local._7_1_ = true;
          }
        }
      }
    }
    else {
      bVar1 = nonstd::optional_lite::optional<tinyusdz::Relationship>::has_value
                        (&this->materialBinding);
      if (bVar1) {
        pvVar4 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                           (&this->materialBinding);
        Relationship::operator=(relOut,pvVar4);
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool get_materialBinding(const value::token &mat_purpose, Relationship *relOut) const {
    if (!relOut) {
      return false;
    }

    if (mat_purpose.str().empty()) {
      if (materialBinding.has_value()) {
        (*relOut) = materialBinding.value();
        return true;
      } else {
        return false; // not authored
      }
    } else if (mat_purpose.str() == "full") {
      if (materialBindingFull.has_value()) {
        (*relOut) = materialBindingFull.value();
        return true;
      } else {
        return false; // not authored
      }
    } else if (mat_purpose.str() == "preview") {
      if (materialBindingPreview.has_value()) {
        (*relOut) = materialBindingPreview.value();
        return true;
      } else {
        return false; // not authored
      }
    } else {
      if (_materialBindingMap.count(mat_purpose.str())) {
        (*relOut) = _materialBindingMap.at(mat_purpose.str());
        return true;
      } else {
        return false; // not authored
      }
    }
  }